

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O3

void __thiscall SM83::ill(SM83 *this,u8 opcode)

{
  text_style *ptVar1;
  format_string<const_unsigned_char_&,_unsigned_short_&> fmt;
  unsigned_short *in_stack_ffffffffffffff98;
  u8 local_59;
  color_type local_58;
  color_type cStack_50;
  undefined4 local_48;
  text_style local_40;
  text_style local_28;
  
  local_59 = opcode;
  Bus::DumpMemoryToFile(this->bus);
  local_40.background_color.is_rgb = false;
  local_40.background_color.value.term_color = '\0';
  local_40.ems = ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold);
  local_40.foreground_color.is_rgb = true;
  local_40.foreground_color._1_3_ = 0;
  local_40.foreground_color.value = (color_union)0xff00ff;
  local_40.set_foreground_color = true;
  local_40.set_background_color = false;
  local_28.foreground_color.is_rgb = false;
  local_28.foreground_color.value.term_color = '\0';
  local_28.background_color.is_rgb = false;
  local_28.background_color.value.term_color = '\0';
  local_28.set_foreground_color = false;
  local_28.set_background_color = false;
  local_28.ems = bold;
  ptVar1 = ::fmt::v11::text_style::operator|=(&local_28,&local_40);
  local_58 = ptVar1->foreground_color;
  cStack_50 = ptVar1->background_color;
  local_48._0_1_ = ptVar1->set_foreground_color;
  local_48._1_1_ = ptVar1->set_background_color;
  local_48._2_1_ = ptVar1->ems;
  local_48._3_1_ = ptVar1->field_0x13;
  fmt.str_.size_ = (size_t)&local_59;
  fmt.str_.data_ = (char *)0x2f;
  ::fmt::v11::print<unsigned_char_const&,unsigned_short&>
            (_stdout,(FILE *)&local_58,
             (text_style *)"fatal: illegal opcode 0x{:02X} at 0x{:04X}\x1b[0m\n",fmt,
             (uchar *)&this->pc_at_opcode,in_stack_ffffffffffffff98);
  DumpRegisters(this);
  return;
}

Assistant:

void SM83::ill(const u8 opcode) {
    bus.DumpMemoryToFile();
    LFATAL("illegal opcode 0x{:02X} at 0x{:04X}", opcode, pc_at_opcode);
    DumpRegisters();
}